

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_energy_deleted(ofstream *fout_energy_deleted)

{
  ostream *poVar1;
  ulong uVar2;
  int n;
  long lVar3;
  unique_ptr<double[],_std::default_delete<double[]>_> ienergy_deleted;
  double energy_ph_deleted;
  double energy_p_deleted;
  double energy_e_deleted;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < (long)n_ion_populations) {
    uVar2 = (long)n_ion_populations * 8;
  }
  ienergy_deleted._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(uVar2);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x108,
             &energy_e_deleted,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x110,
             &energy_p_deleted,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x118,
             &energy_ph_deleted,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce(*(undefined8 *)
              ((long)psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x120),
             ienergy_deleted._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
             .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,n_ion_populations,&ompi_mpi_double,
             &ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    poVar1 = std::ostream::_M_insert<double>(energy_e_deleted);
    std::operator<<(poVar1,'\t');
    poVar1 = std::ostream::_M_insert<double>(energy_p_deleted);
    std::operator<<(poVar1,'\t');
    std::ostream::_M_insert<double>(energy_ph_deleted);
    for (lVar3 = 0; lVar3 < n_ion_populations; lVar3 = lVar3 + 1) {
      std::operator<<((ostream *)fout_energy_deleted,'\t');
      std::ostream::_M_insert<double>
                (*(double *)
                  ((long)ienergy_deleted._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3 * 8));
    }
    std::endl<char,std::char_traits<char>>((ostream *)fout_energy_deleted);
  }
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ienergy_deleted);
  return;
}

Assistant:

void write_energy_deleted(ofstream& fout_energy_deleted)
{
    double energy_e_deleted, energy_p_deleted, energy_ph_deleted;
    auto ienergy_deleted = unique_ptr<double[]>(new double[n_ion_populations]);
    MPI_Reduce(&(psr->energy_e_deleted), &energy_e_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_p_deleted), &energy_p_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_ph_deleted), &energy_ph_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->ienergy_deleted, ienergy_deleted.get(), n_ion_populations, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_energy_deleted << energy_e_deleted << '\t' << energy_p_deleted << '\t' << energy_ph_deleted;
        for (int n=0; n<n_ion_populations; n++)
            fout_energy_deleted << '\t' << ienergy_deleted[n];
        fout_energy_deleted << endl;
    }
}